

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

void __thiscall
google::protobuf::Reflection::VerifyFieldType<google::protobuf::internal::ArenaStringPtr>
          (Reflection *this,FieldDescriptor *field)

{
  byte bVar1;
  int iVar2;
  CppStringType CVar3;
  OneofDescriptor *pOVar4;
  Nonnull<const_char_*> pcVar5;
  bool v1;
  size_type in_R9;
  UntypedFormatSpecImpl format;
  UntypedFormatSpecImpl format_00;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  anon_class_8_1_a7e8901a error;
  FieldDescriptor **local_88;
  string local_80;
  LogMessage local_60;
  FieldDescriptor *local_50;
  undefined1 local_48 [32];
  undefined8 local_28;
  char *local_20;
  ulong local_18;
  char *local_10;
  
  local_88 = &local_50;
  bVar1 = field->field_0x1;
  v1 = (bool)((bVar1 & 0x20) >> 5);
  local_50 = field;
  if (0xbf < bVar1 == v1) {
    pcVar5 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (v1,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar5 != (Nonnull<const_char_*>)0x0) {
    VerifyFieldType<google::protobuf::internal::ArenaStringPtr>();
    if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
LAB_002081b5:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  if ((field->field_0x1 & 0x20) == 0) {
    pcVar5 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (true,false,"field->is_repeated() == internal::IsRepeatedT<T>");
  }
  if (pcVar5 == (Nonnull<const_char_*>)0x0) {
    iVar2 = 1;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_50->type_ * 4) != 8) {
      iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_50->type_ * 4);
    }
    if (iVar2 == 9) {
      pcVar5 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)iVar2,9,"+cpp_type == +internal::GetCppType<T>()");
    }
    if (pcVar5 == (Nonnull<const_char_*>)0x0) {
      CVar3 = FieldDescriptor::cpp_string_type(local_50);
      if (CVar3 != kCord) {
        return;
      }
      pOVar4 = FieldDescriptor::real_containing_oneof(local_50);
      if (pOVar4 == (OneofDescriptor *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
                   ,0x6de,
                   "(std::is_same_v<T, absl::Cord> || std::is_same_v<T, RepeatedField<absl::Cord>>)"
                  );
        const::{lambda()#1}::operator()[abi_cxx11_((string *)local_48,&local_88);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  ((LogMessage *)&local_80,(string *)local_48);
      }
      else {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
                   ,0x6db,"(std::is_same_v<T, absl::Cord*>)");
        const::{lambda()#1}::operator()[abi_cxx11_((string *)local_48,&local_88);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  ((LogMessage *)&local_80,(string *)local_48);
      }
      std::__cxx11::string::~string((string *)local_48);
      goto LAB_002081b5;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
               ,0x6bf,pcVar5);
    local_10 = ((*local_88)->all_names_).payload_;
    local_18 = (ulong)*(ushort *)(local_10 + 2);
    local_48._0_8_ = &local_18;
    local_10 = local_10 + ~local_18;
    local_48._16_8_ = &local_28;
    local_28 = 0x2b;
    local_20 = "N6google8protobuf8internal14ArenaStringPtrE";
    local_48._8_8_ =
         absl::lts_20250127::str_format_internal::FormatArgImpl::
         Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    local_48._24_8_ =
         absl::lts_20250127::str_format_internal::FormatArgImpl::
         Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    format_00.size_ = (size_t)local_48;
    format_00.data_ = (void *)0x1e;
    args_00.len_ = in_R9;
    args_00.ptr_ = (pointer)0x2;
    absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
              (&local_80,(str_format_internal *)"Invalid cast of %s to type %s.",format_00,args_00);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_60,&local_80);
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
               ,0x6b3,pcVar5);
    local_10 = ((*local_88)->all_names_).payload_;
    local_18 = (ulong)*(ushort *)(local_10 + 2);
    local_48._0_8_ = &local_18;
    local_10 = local_10 + ~local_18;
    local_48._16_8_ = &local_28;
    local_28 = 0x2b;
    local_20 = "N6google8protobuf8internal14ArenaStringPtrE";
    local_48._8_8_ =
         absl::lts_20250127::str_format_internal::FormatArgImpl::
         Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    local_48._24_8_ =
         absl::lts_20250127::str_format_internal::FormatArgImpl::
         Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    format.size_ = (size_t)local_48;
    format.data_ = (void *)0x1e;
    args.len_ = in_R9;
    args.ptr_ = (pointer)0x2;
    absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
              (&local_80,(str_format_internal *)"Invalid cast of %s to type %s.",format,args);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_60,&local_80);
  }
  std::__cxx11::string::~string((string *)&local_80);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

void Reflection::VerifyFieldType(const FieldDescriptor* field) const {
  if constexpr (!internal::PerformDebugChecks()) {
    return;
  }
  if constexpr (std::is_const_v<T>) {
    return VerifyFieldType<std::remove_const_t<T>>(field);
  }

  // `char` and `void` are used in places where we don't know the type yet.
  if constexpr (std::is_same_v<T, char> || std::is_same_v<T, void>) {
    return;
  }

  const auto error = [&] {
    return absl::StrFormat("Invalid cast of %s to type %s.", field->full_name(),
                           internal::RttiTypeName<T>().value_or("unknown"));
  };

  ABSL_DCHECK_EQ(field->is_repeated(), internal::IsRepeatedT<T>) << error();
  if constexpr (std::is_same_v<T, internal::MapFieldBase>) {
    ABSL_DCHECK(field->is_map()) << error();
  } else if constexpr (std::is_same_v<T, internal::RepeatedPtrFieldBase>) {
    // It has to be string or message.
    ABSL_DCHECK(field->cpp_type() == field->CPPTYPE_STRING ||
                field->cpp_type() == field->CPPTYPE_MESSAGE)
        << error();
  } else {
    auto cpp_type = field->cpp_type();
    // Collapse ENUM to INT32 because they are the same through reflection.
    if (cpp_type == field->CPPTYPE_ENUM) cpp_type = field->CPPTYPE_INT32;
    ABSL_DCHECK_EQ(+cpp_type, +internal::GetCppType<T>()) << error();

    // Check subfield types for message.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_MESSAGE) {
      // Singular/oneof messages are by pointer, except non-oneof Lazy.
      if (!field->is_repeated() &&
          (!IsLazyField(field) || field->real_containing_oneof() != nullptr)) {
        ABSL_DCHECK(std::is_pointer_v<T>) << error();
      }
    }

    // Check subfield types for string.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_STRING) {
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString:
          if (IsMicroString(field)) {
            ABSL_DCHECK((std::is_same_v<T, internal::MicroString>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, internal::ArenaStringPtr> ||
                         std::is_same_v<T, RepeatedPtrField<std::string>>))
                << error();
          }
          break;
        case FieldDescriptor::CppStringType::kCord:
          if (field->real_containing_oneof() != nullptr) {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord*>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord> ||
                         std::is_same_v<T, RepeatedField<absl::Cord>>))
                << error();
          }
          break;
      }
    }
  }
}